

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O1

void ImGuiStb::stb_textedit_discard_undo(StbUndoState *state)

{
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  
  if (0 < state->undo_point) {
    if (-1 < state->undo_rec[0].char_storage) {
      sVar3 = state->undo_rec[0].insert_length;
      sVar2 = state->undo_char_point - sVar3;
      state->undo_char_point = sVar2;
      memmove(state->undo_char,state->undo_char + sVar3,(long)sVar2 * 2);
      sVar2 = state->undo_point;
      if (0 < (long)sVar2) {
        lVar4 = 0;
        do {
          sVar1 = *(short *)((long)&state->undo_rec[0].char_storage + lVar4);
          if (-1 < sVar1) {
            *(short *)((long)&state->undo_rec[0].char_storage + lVar4) = sVar1 - sVar3;
          }
          lVar4 = lVar4 + 0xc;
        } while ((long)sVar2 * 0xc != lVar4);
      }
    }
    sVar3 = state->undo_point + -1;
    state->undo_point = sVar3;
    memmove(state,state->undo_rec + 1,(long)sVar3 * 0xc);
    return;
  }
  return;
}

Assistant:

static void stb_textedit_discard_undo(StbUndoState *state)
{
   if (state->undo_point > 0) {
      // if the 0th undo state has characters, clean those up
      if (state->undo_rec[0].char_storage >= 0) {
         int n = state->undo_rec[0].insert_length, i;
         // delete n characters from all other records
         state->undo_char_point = state->undo_char_point - (short) n;  // vsnet05
         STB_TEXTEDIT_memmove(state->undo_char, state->undo_char + n, (size_t) ((size_t)state->undo_char_point*sizeof(STB_TEXTEDIT_CHARTYPE)));
         for (i=0; i < state->undo_point; ++i)
            if (state->undo_rec[i].char_storage >= 0)
               state->undo_rec[i].char_storage = state->undo_rec[i].char_storage - (short) n; // vsnet05 // @OPTIMIZE: get rid of char_storage and infer it
      }
      --state->undo_point;
      STB_TEXTEDIT_memmove(state->undo_rec, state->undo_rec+1, (size_t) ((size_t)state->undo_point*sizeof(state->undo_rec[0])));
   }
}